

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O3

int run_test_spawn_fs_open(void)

{
  int iVar1;
  int extraout_EAX;
  undefined8 uVar2;
  uv_buf_t *buf;
  ulong unaff_RBX;
  undefined1 *nread;
  uv_stream_t *tcp;
  undefined1 auVar3 [16];
  int64_t eval_b_3;
  int64_t eval_b_4;
  uv_os_fd_t fd;
  uv_os_fd_t dup_fd;
  char dev_null [10];
  uv_stdio_container_t stdio [1];
  uv_write_t write_req2;
  uv_write_t write_req;
  uv_pipe_t in;
  uv_fs_t fs_req;
  undefined1 auStack_7e0 [48];
  uv_handle_t *apuStack_7b0 [11];
  uv_loop_t *puStack_758;
  undefined8 auStack_5f0 [29];
  uv_stdio_container_t uStack_508;
  undefined4 uStack_4f8;
  undefined4 uStack_4e8;
  ulong uStack_4d0;
  long local_498;
  uint local_490;
  int local_48c;
  undefined1 local_488 [16];
  undefined8 local_478;
  undefined2 local_470;
  uv_stdio_container_t local_468;
  long local_450 [25];
  long local_388 [25];
  long local_2c0 [29];
  undefined1 local_1d8 [88];
  uint local_180;
  
  local_478 = 0x6c756e2f7665642f;
  local_470 = 0x6c;
  iVar1 = uv_fs_open(0,local_1d8,&local_478,2,0,0);
  local_2c0[0] = (long)iVar1;
  local_388[0] = 0;
  if (local_2c0[0] == 0) {
    unaff_RBX = (ulong)local_180;
    local_490 = local_180;
    init_process_options("spawn_helper8",exit_cb);
    uVar2 = uv_default_loop();
    iVar1 = uv_pipe_init(uVar2,(uv_stream_t *)local_2c0,0);
    local_388[0] = (long)iVar1;
    local_450[0] = 0;
    if (local_388[0] != 0) goto LAB_001c2eb0;
    options.stdio = &local_468;
    local_468.flags = UV_READABLE_PIPE|UV_CREATE_PIPE;
    options.stdio_count = 1;
    local_468.data.stream = (uv_stream_t *)local_2c0;
    local_48c = dup(local_180);
    uVar2 = uv_default_loop();
    iVar1 = uv_spawn(uVar2,&process,&options);
    local_388[0] = (long)iVar1;
    local_450[0] = 0;
    if (local_388[0] != 0) goto LAB_001c2ec2;
    local_488 = uv_buf_init(&local_490,4);
    iVar1 = uv_write(local_388,local_2c0,local_488,1,write_null_cb);
    local_450[0] = (long)iVar1;
    if (local_450[0] != 0) goto LAB_001c2ed4;
    auVar3 = uv_buf_init(&local_48c,4);
    local_488 = auVar3;
    iVar1 = uv_write(local_450,local_2c0,local_488,1,write_cb);
    local_498 = 0;
    if (iVar1 != 0) goto LAB_001c2ee3;
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,0);
    local_498 = 0;
    if (iVar1 != 0) goto LAB_001c2ef2;
    iVar1 = uv_fs_close(0,local_1d8,local_490,0);
    local_498 = 0;
    if (iVar1 != 0) goto LAB_001c2f01;
    local_498 = (long)exit_cb_called;
    if (local_498 != 1) goto LAB_001c2f10;
    local_498 = (long)close_cb_called;
    if (local_498 != 2) goto LAB_001c2f1f;
    unaff_RBX = uv_default_loop();
    uv_walk(unaff_RBX,close_walk_cb,0);
    uv_run(unaff_RBX,0);
    uVar2 = uv_default_loop();
    iVar1 = uv_loop_close(uVar2);
    local_498 = (long)iVar1;
    if (local_498 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_spawn_fs_open_cold_1();
LAB_001c2eb0:
    run_test_spawn_fs_open_cold_2();
LAB_001c2ec2:
    run_test_spawn_fs_open_cold_3();
LAB_001c2ed4:
    run_test_spawn_fs_open_cold_4();
LAB_001c2ee3:
    run_test_spawn_fs_open_cold_5();
LAB_001c2ef2:
    run_test_spawn_fs_open_cold_6();
LAB_001c2f01:
    run_test_spawn_fs_open_cold_7();
LAB_001c2f10:
    run_test_spawn_fs_open_cold_8();
LAB_001c2f1f:
    run_test_spawn_fs_open_cold_9();
  }
  iVar1 = (int)&local_498;
  run_test_spawn_fs_open_cold_10();
  if (iVar1 == 0) {
    return 0;
  }
  write_null_cb_cold_1();
  uStack_4d0 = unaff_RBX;
  auStack_7e0._24_16_ = uv_buf_init("",1);
  iVar1 = uv_pipe(auStack_7e0 + 0x10,0,0);
  if (iVar1 == 0) {
    init_process_options("spawn_helper4",exit_cb);
    options.stdio_count = 3;
    options.stdio = &uStack_508;
    uStack_508.flags = UV_INHERIT_FD;
    uStack_508.data.file = auStack_7e0._16_4_;
    uStack_4f8 = 0;
    uStack_4e8 = 0;
    uVar2 = uv_default_loop();
    iVar1 = uv_spawn(uVar2,&process,&options);
    apuStack_7b0[0] = (uv_handle_t *)(long)iVar1;
    auStack_5f0[0] = 0;
    if (apuStack_7b0[0] != (uv_handle_t *)0x0) goto LAB_001c33eb;
    uv_unref(&process);
    uVar2 = uv_default_loop();
    iVar1 = uv_pipe_init(uVar2,auStack_5f0,0);
    apuStack_7b0[0] = (uv_handle_t *)(long)iVar1;
    auStack_7e0._0_8_ = (uv_loop_t *)0x0;
    if (apuStack_7b0[0] != (uv_handle_t *)0x0) goto LAB_001c33fd;
    iVar1 = uv_pipe_open(auStack_5f0,auStack_7e0._16_4_);
    apuStack_7b0[0] = (uv_handle_t *)(long)iVar1;
    auStack_7e0._0_8_ = (uv_loop_t *)0x0;
    if (apuStack_7b0[0] != (uv_handle_t *)0x0) goto LAB_001c340c;
    auStack_7e0._16_4_ = ~UV_UNKNOWN_HANDLE;
    iVar1 = uv_read_start(auStack_5f0,on_alloc,on_read_once);
    apuStack_7b0[0] = (uv_handle_t *)(long)iVar1;
    auStack_7e0._0_8_ = (uv_loop_t *)0x0;
    if (apuStack_7b0[0] != (uv_handle_t *)0x0) goto LAB_001c341b;
    auStack_7e0._0_8_ = (uv_loop_t *)0x1;
    iVar1 = uv_fs_write(0,apuStack_7b0,auStack_7e0._20_4_,auStack_7e0 + 0x18,1,0xffffffffffffffff,0)
    ;
    auStack_7e0._8_8_ = SEXT48(iVar1);
    if (auStack_7e0._0_8_ != auStack_7e0._8_8_) goto LAB_001c342a;
    auStack_7e0._0_8_ = (uv_loop_t *)0x1;
    auStack_7e0._8_8_ = puStack_758;
    if (puStack_758 != (uv_loop_t *)0x1) goto LAB_001c3439;
    uv_fs_req_cleanup(apuStack_7b0);
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,1);
    auStack_7e0._0_8_ = SEXT48(iVar1);
    auStack_7e0._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_7e0._0_8_ != (uv_loop_t *)0x0) goto LAB_001c3448;
    auStack_7e0._0_8_ = (uv_loop_t *)0x1;
    auStack_7e0._8_8_ = SEXT48(output_used);
    if ((uv_loop_t *)auStack_7e0._8_8_ != (uv_loop_t *)0x1) goto LAB_001c3457;
    uv_close(auStack_5f0,close_cb);
    auStack_7e0._0_8_ = (uv_loop_t *)0x1;
    iVar1 = uv_fs_write(0,apuStack_7b0,auStack_7e0._20_4_,auStack_7e0 + 0x18,1,0xffffffffffffffff,0)
    ;
    auStack_7e0._8_8_ = SEXT48(iVar1);
    if (auStack_7e0._0_8_ != auStack_7e0._8_8_) goto LAB_001c3466;
    auStack_7e0._0_8_ = (uv_loop_t *)0x1;
    auStack_7e0._8_8_ = puStack_758;
    if (puStack_758 != (uv_loop_t *)0x1) goto LAB_001c3475;
    uv_fs_req_cleanup(apuStack_7b0);
    uVar2 = uv_default_loop();
    iVar1 = uv_timer_init(uVar2,&timer);
    auStack_7e0._0_8_ = SEXT48(iVar1);
    auStack_7e0._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_7e0._0_8_ != (uv_loop_t *)0x0) goto LAB_001c3484;
    iVar1 = uv_timer_start(&timer,timer_counter_cb,10,0);
    auStack_7e0._0_8_ = SEXT48(iVar1);
    auStack_7e0._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_7e0._0_8_ != (uv_loop_t *)0x0) goto LAB_001c3493;
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,1);
    if (iVar1 == 1) {
      uVar2 = uv_default_loop();
      iVar1 = uv_run(uVar2,1);
      auStack_7e0._0_8_ = SEXT48(iVar1);
      auStack_7e0._8_8_ = (uv_loop_t *)0x0;
      if ((uv_loop_t *)auStack_7e0._0_8_ != (uv_loop_t *)0x0) goto LAB_001c34de;
    }
    auStack_7e0._0_8_ = (uv_loop_t *)0x1;
    auStack_7e0._8_8_ = SEXT48(timer_counter);
    if ((uv_loop_t *)auStack_7e0._8_8_ != (uv_loop_t *)0x1) goto LAB_001c34a2;
    iVar1 = uv_process_kill(&process,0xf);
    auStack_7e0._0_8_ = SEXT48(iVar1);
    auStack_7e0._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_7e0._0_8_ != (uv_loop_t *)0x0) goto LAB_001c34b1;
    iVar1 = close(auStack_7e0._20_4_);
    auStack_7e0._0_8_ = SEXT48(iVar1);
    auStack_7e0._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_7e0._0_8_ != (uv_loop_t *)0x0) goto LAB_001c34c0;
    auStack_7e0._20_4_ = -1;
    uVar2 = uv_default_loop();
    uv_walk(uVar2,close_walk_cb,0);
    uv_run(uVar2,0);
    auStack_7e0._0_8_ = (uv_loop_t *)0x0;
    uVar2 = uv_default_loop();
    iVar1 = uv_loop_close(uVar2);
    auStack_7e0._8_8_ = SEXT48(iVar1);
    if (auStack_7e0._0_8_ == auStack_7e0._8_8_) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_closed_fd_events_cold_1();
LAB_001c33eb:
    run_test_closed_fd_events_cold_2();
LAB_001c33fd:
    run_test_closed_fd_events_cold_3();
LAB_001c340c:
    run_test_closed_fd_events_cold_4();
LAB_001c341b:
    run_test_closed_fd_events_cold_5();
LAB_001c342a:
    run_test_closed_fd_events_cold_6();
LAB_001c3439:
    run_test_closed_fd_events_cold_7();
LAB_001c3448:
    run_test_closed_fd_events_cold_8();
LAB_001c3457:
    run_test_closed_fd_events_cold_9();
LAB_001c3466:
    run_test_closed_fd_events_cold_10();
LAB_001c3475:
    run_test_closed_fd_events_cold_11();
LAB_001c3484:
    run_test_closed_fd_events_cold_12();
LAB_001c3493:
    run_test_closed_fd_events_cold_13();
LAB_001c34a2:
    run_test_closed_fd_events_cold_15();
LAB_001c34b1:
    run_test_closed_fd_events_cold_16();
LAB_001c34c0:
    run_test_closed_fd_events_cold_17();
  }
  run_test_closed_fd_events_cold_18();
LAB_001c34de:
  tcp = (uv_stream_t *)auStack_7e0;
  nread = auStack_7e0 + 8;
  run_test_closed_fd_events_cold_14();
  uv_read_stop();
  on_read(tcp,(ssize_t)nread,buf);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(spawn_fs_open) {
  int r;
  uv_os_fd_t fd;
  uv_os_fd_t dup_fd;
  uv_fs_t fs_req;
  uv_pipe_t in;
  uv_write_t write_req;
  uv_write_t write_req2;
  uv_buf_t buf;
  uv_stdio_container_t stdio[1];
#ifdef _WIN32
  const char dev_null[] = "NUL";
  HMODULE kernelbase_module;
  sCompareObjectHandles pCompareObjectHandles; /* function introduced in Windows 10 */
#else
  const char dev_null[] = "/dev/null";
#endif

  r = uv_fs_open(NULL, &fs_req, dev_null, UV_FS_O_RDWR, 0, NULL);
  ASSERT_OK(r);
  fd = (uv_os_fd_t) fs_req.result;

  init_process_options("spawn_helper8", exit_cb);

  ASSERT_OK(uv_pipe_init(uv_default_loop(), &in, 0));

  options.stdio = stdio;
  options.stdio[0].flags = UV_CREATE_PIPE | UV_READABLE_PIPE;
  options.stdio[0].data.stream = (uv_stream_t*) &in;
  options.stdio_count = 1;

  /* make an inheritable copy */
#ifdef _WIN32
  ASSERT_NE(0, DuplicateHandle(GetCurrentProcess(), fd, GetCurrentProcess(), &dup_fd,
                               0, /* inherit */ TRUE, DUPLICATE_SAME_ACCESS));
  kernelbase_module = GetModuleHandleA("kernelbase.dll");
  pCompareObjectHandles = (sCompareObjectHandles)
      GetProcAddress(kernelbase_module, "CompareObjectHandles");
  ASSERT_NE(pCompareObjectHandles == NULL ||
            pCompareObjectHandles(fd, dup_fd),
            0);
#else
  dup_fd = dup(fd);
#endif

  ASSERT_OK(uv_spawn(uv_default_loop(), &process, &options));

  buf = uv_buf_init((char*) &fd, sizeof(fd));
  ASSERT_OK(uv_write(&write_req,
                     (uv_stream_t*) &in,
                     &buf,
                     1,
                     write_null_cb));

  buf = uv_buf_init((char*) &dup_fd, sizeof(fd));
  ASSERT_OK(uv_write(&write_req2, (uv_stream_t*) &in, &buf, 1, write_cb));

  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));
  ASSERT_OK(uv_fs_close(NULL, &fs_req, fd, NULL));

  ASSERT_EQ(1, exit_cb_called);
  ASSERT_EQ(2, close_cb_called);  /* One for `in`, one for process */

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}